

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_nextInputSizeHint(ZSTD_CCtx *cctx)

{
  ZSTD_bufferMode_e ZVar1;
  size_t sVar2;
  
  ZVar1 = (cctx->appliedParams).inBufferMode;
  if (ZVar1 == ZSTD_bm_buffered) {
    sVar2 = cctx->inBuffTarget - cctx->inBuffPos;
    if (sVar2 != 0) {
      return sVar2;
    }
    return cctx->blockSize;
  }
  if (ZVar1 == ZSTD_bm_stable) {
    return cctx->blockSize - cctx->stableIn_notConsumed;
  }
  __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_buffered",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6796,"size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx *)");
}

Assistant:

static size_t ZSTD_nextInputSizeHint(const ZSTD_CCtx* cctx)
{
    if (cctx->appliedParams.inBufferMode == ZSTD_bm_stable) {
        return cctx->blockSize - cctx->stableIn_notConsumed;
    }
    assert(cctx->appliedParams.inBufferMode == ZSTD_bm_buffered);
    {   size_t hintInSize = cctx->inBuffTarget - cctx->inBuffPos;
        if (hintInSize==0) hintInSize = cctx->blockSize;
        return hintInSize;
    }
}